

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clock.cc
# Opt level: O1

attributes_t * __thiscall tchecker::system::clocks_t::clock_attributes(clocks_t *this,clock_id_t id)

{
  pointer paVar1;
  ulong uVar2;
  invalid_argument *this_00;
  ulong uVar3;
  
  uVar2 = (ulong)id;
  paVar1 = (this->_clock_variables_attributes).
           super__Vector_base<tchecker::system::attributes_t,_std::allocator<tchecker::system::attributes_t>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = ((long)(this->_clock_variables_attributes).
                 super__Vector_base<tchecker::system::attributes_t,_std::allocator<tchecker::system::attributes_t>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)paVar1 >> 3) *
          0x6db6db6db6db6db7;
  if (uVar2 <= uVar3 && uVar3 - uVar2 != 0) {
    return paVar1 + uVar2;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"Unknown clock variable identifier");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

tchecker::system::attributes_t const & clocks_t::clock_attributes(tchecker::clock_id_t id) const
{
  if (id >= _clock_variables_attributes.size())
    throw std::invalid_argument("Unknown clock variable identifier");
  return _clock_variables_attributes[id];
}